

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuizmo.cpp
# Opt level: O2

float ImGuizmo::ComputeAngleOnPlan(void)

{
  vec_t *in_RDX;
  vec_t *in_RSI;
  uint uVar1;
  float fVar2;
  float fVar3;
  vec_t vVar4;
  vec_t perpendicularVector;
  float local_78;
  float fStack_74;
  float local_68;
  vec_t local_40;
  vec_t local_30;
  vec_t local_20;
  
  fVar2 = IntersectRayPlane((vec_t *)&DAT_001f12ec,in_RSI,in_RDX);
  local_30 = vec_t::operator*((vec_t *)&DAT_001f12ac,fVar2);
  local_20 = vec_t::operator+((vec_t *)&DAT_001f129c,&local_30);
  local_40 = vec_t::operator-(&local_20,(vec_t *)&DAT_001f10fc);
  vVar4 = Normalized(&local_40);
  vec_t::Cross(&local_40,(vec_t *)&DAT_001f131c,(vec_t *)&DAT_001f12ec);
  vec_t::Normalize(&local_40);
  local_78 = vVar4.x;
  fStack_74 = vVar4.y;
  local_68 = vVar4.z;
  fVar3 = DAT_001f1324 * local_68 + DAT_001f131c * local_78 + DAT_001f1320 * fStack_74;
  fVar2 = 0.9999;
  if (fVar3 <= 0.9999) {
    fVar2 = fVar3;
  }
  fVar2 = acosf((float)(-(uint)(fVar3 < -0.9999) & 0xbf7ff972 |
                       ~-(uint)(fVar3 < -0.9999) & (uint)fVar2));
  uVar1 = -(uint)(local_68 * local_40.z + local_40.x * local_78 + fStack_74 * local_40.y < 0.0);
  return (float)((uint)fVar2 & uVar1 | ~uVar1 & (uint)-fVar2);
}

Assistant:

static float ComputeAngleOnPlan()
   {
      const float len = IntersectRayPlane(gContext.mRayOrigin, gContext.mRayVector, gContext.mTranslationPlan);
      vec_t localPos = Normalized(gContext.mRayOrigin + gContext.mRayVector * len - gContext.mModel.v.position);

      vec_t perpendicularVector;
      perpendicularVector.Cross(gContext.mRotationVectorSource, gContext.mTranslationPlan);
      perpendicularVector.Normalize();
      float acosAngle = Clamp(Dot(localPos, gContext.mRotationVectorSource), -0.9999f, 0.9999f);
      float angle = acosf(acosAngle);
      angle *= (Dot(localPos, perpendicularVector) < 0.f) ? 1.f : -1.f;
      return angle;
   }